

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandCollapse(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  uVar3 = 0;
  Extra_UtilGetoptReset();
  local_54 = 1;
  local_5c = 1000000000;
  local_58 = 0;
  local_50 = 0;
  local_4c = 0;
  pcVar4 = (char *)0x0;
LAB_0024edf4:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"BLrodxvh"), iVar6 = globalUtilOptind, iVar1 == 0x4c)
    {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-L\" should be followed by a file name.\n";
LAB_0024eefa:
        Abc_Print(-1,pcVar5);
        goto switchD_0024ee3d_caseD_70;
      }
      pcVar4 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
    if (iVar1 < 0x6f) {
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          if (pAVar2->ntkType == ABC_NTK_LOGIC) {
            pNtk = Abc_NtkStrash(pAVar2,0,0,0);
            pAVar2 = Abc_NtkCollapse(pNtk,local_5c,local_58,local_54,local_50,local_4c,uVar3);
            Abc_NtkDelete(pNtk);
          }
          else {
            if (pAVar2->ntkType != ABC_NTK_STRASH) {
              pcVar4 = "Can only collapse a logic network or an AIG.\n";
              goto LAB_0024f0d5;
            }
            pAVar2 = Abc_NtkCollapse(pAVar2,local_5c,local_58,local_54,local_50,local_4c,uVar3);
          }
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            if (pcVar4 != (char *)0x0) {
              pAbc->pCex = (Abc_Cex_t *)0x0;
              pAbc->nFrames = -1;
              uVar3 = -(uint)(pAVar2->nObjCounts[7] != 0) | 1;
              pAbc->Status = uVar3;
              Abc_NtkWriteLogFile(pcVar4,(Abc_Cex_t *)0x0,uVar3,-1,"collapse");
              return 0;
            }
            return 0;
          }
          pcVar4 = "Collapsing has failed.\n";
        }
LAB_0024f0d5:
        iVar6 = -1;
        goto LAB_0024f0da;
      }
      if (iVar1 == 0x42) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-B\" should be followed by an integer.\n";
          goto LAB_0024eefa;
        }
        local_5c = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar6 + 1;
        if ((int)local_5c < 0) {
switchD_0024ee3d_caseD_70:
          Abc_Print(-2,"usage: collapse [-B <num>] [-L file] [-rodxvh]\n");
          Abc_Print(-2,"\t          collapses the network by constructing global BDDs\n");
          Abc_Print(-2,"\t-B <num>: limit on live BDD nodes during collapsing [default = %d]\n",
                    (ulong)local_5c);
          pcVar5 = "no logging";
          if (pcVar4 != (char *)0x0) {
            pcVar5 = pcVar4;
          }
          Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",pcVar5);
          pcVar5 = "yes";
          pcVar4 = "yes";
          if (local_54 == 0) {
            pcVar4 = "no";
          }
          Abc_Print(-2,"\t-r      : toggles dynamic variable reordering [default = %s]\n",pcVar4);
          pcVar4 = "yes";
          if (local_50 == 0) {
            pcVar4 = "no";
          }
          Abc_Print(-2,"\t-o      : toggles reverse variable ordering [default = %s]\n",pcVar4);
          pcVar4 = "yes";
          if (local_58 == 0) {
            pcVar4 = "no";
          }
          Abc_Print(-2,"\t-d      : toggles dual-rail collapsing mode [default = %s]\n",pcVar4);
          pcVar4 = "yes";
          if (local_4c == 0) {
            pcVar4 = "no";
          }
          Abc_Print(-2,
                    "\t-x      : toggles dumping file \"order.txt\" with variable order [default = %s]\n"
                    ,pcVar4);
          if (uVar3 == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-v      : print verbose information [default = %s]\n",pcVar5);
          pcVar4 = "\t-h      : print the command usage\n";
          iVar6 = -2;
LAB_0024f0da:
          Abc_Print(iVar6,pcVar4);
          return 1;
        }
      }
      else {
        if (iVar1 != 100) goto switchD_0024ee3d_caseD_70;
        local_58 = local_58 ^ 1;
      }
      goto LAB_0024edf4;
    }
    switch(iVar1) {
    case 0x6f:
      local_50 = local_50 ^ 1;
      break;
    default:
      goto switchD_0024ee3d_caseD_70;
    case 0x72:
      local_54 = local_54 ^ 1;
      break;
    case 0x76:
      uVar3 = uVar3 ^ 1;
      break;
    case 0x78:
      local_4c = local_4c ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCollapse( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fVerbose;
    int fBddSizeMax;
    int fDualRail;
    int fReorder;
    int fReverse;
    int fDumpOrder;
    int c;
    char * pLogFileName = NULL;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fVerbose = 0;
    fReorder = 1;
    fReverse = 0;
    fDualRail = 0;
    fDumpOrder = 0;
    fBddSizeMax = ABC_INFINITY;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "BLrodxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            fBddSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( fBddSizeMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            fReorder ^= 1;
            break;
        case 'o':
            fReverse ^= 1;
            break;
        case 'd':
            fDualRail ^= 1;
            break;
        case 'x':
            fDumpOrder ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only collapse a logic network or an AIG.\n" );
        return 1;
    }

    // get the new network
    if ( Abc_NtkIsStrash(pNtk) )
        pNtkRes = Abc_NtkCollapse( pNtk, fBddSizeMax, fDualRail, fReorder, fReverse, fDumpOrder, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkRes = Abc_NtkCollapse( pNtk, fBddSizeMax, fDualRail, fReorder, fReverse, fDumpOrder, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Collapsing has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    if ( pLogFileName )
    {
        pAbc->pCex = NULL;
        pAbc->nFrames = -1;
        if ( Abc_NtkNodeNum(pNtkRes) == 0 ) 
            pAbc->Status =  1; // UNSAT
        else
            pAbc->Status = -1; // UNDEC
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "collapse" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: collapse [-B <num>] [-L file] [-rodxvh]\n" );
    Abc_Print( -2, "\t          collapses the network by constructing global BDDs\n" );
    Abc_Print( -2, "\t-B <num>: limit on live BDD nodes during collapsing [default = %d]\n", fBddSizeMax );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n",  pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r      : toggles dynamic variable reordering [default = %s]\n", fReorder? "yes": "no" );
    Abc_Print( -2, "\t-o      : toggles reverse variable ordering [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dual-rail collapsing mode [default = %s]\n", fDualRail? "yes": "no" );
    Abc_Print( -2, "\t-x      : toggles dumping file \"order.txt\" with variable order [default = %s]\n", fDumpOrder? "yes": "no" );
    Abc_Print( -2, "\t-v      : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}